

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  int iVar1;
  undefined8 uVar2;
  RAStackSlot *this_00;
  undefined8 *puVar3;
  bool bVar4;
  Error EVar5;
  int32_t iVar6;
  uint32_t uVar7;
  Operand *pOVar8;
  BaseRAPass *pBVar9;
  VirtReg **ppVVar10;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int32_t offset;
  RAStackSlot *slot;
  RAWorkReg *workReg;
  VirtReg *virtReg;
  uint32_t virtIndex;
  BaseMem *mem;
  Operand *op;
  BaseNode *prev;
  Error _err;
  RABlock *block;
  uint32_t outId;
  BitWordIterator<unsigned_int> outIt;
  uint32_t useId;
  BitWordIterator<unsigned_int> useIt;
  RATiedReg *tiedReg;
  uint32_t tiedCount;
  RATiedReg *tiedRegs;
  uint32_t i;
  uint32_t maxRegId;
  uint32_t opCount;
  Operand *operands;
  RAInst *raInst;
  InstNode *inst;
  BaseNode *next;
  BaseNode *node;
  uint32_t virtCount;
  BaseNode *in_stack_fffffffffffff7e8;
  BaseRAPass *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  byte in_stack_fffffffffffff7ff;
  BaseRAPass *in_stack_fffffffffffff800;
  BaseRAPass *in_stack_fffffffffffff808;
  uint local_7a4;
  uint local_794;
  undefined4 local_744;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  long local_730;
  uint local_728;
  int local_724;
  uint local_720;
  int local_71c;
  long local_718;
  uint local_70c;
  long local_708;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  uint *local_6f0;
  long *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  uint local_6c4;
  undefined8 *local_6c0;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  uint local_674;
  BaseRAPass *local_670;
  BaseRAPass *local_668;
  uint *local_660;
  uint *local_658;
  uint *local_650;
  uint *local_648;
  uint *local_640;
  uint *local_638;
  uint *local_630;
  uint *local_628;
  BaseRAPass *local_620;
  BaseRAPass *local_618;
  undefined8 *local_610;
  Operand *local_608;
  Operand *local_600;
  uint local_5f4;
  long local_5f0;
  VirtReg *local_5e8;
  undefined8 local_5e0;
  long local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  uint *local_5c0;
  uint *local_5b8;
  undefined4 local_5ac;
  uint *local_5a8;
  undefined4 local_59c;
  uint *local_598;
  undefined4 local_58c;
  uint *local_588;
  undefined4 local_57c;
  uint *local_578;
  int32_t local_56c;
  BaseRAPass *local_568;
  long local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  long *local_508;
  long *local_500;
  long local_4f8;
  int local_4ec;
  int *local_4e8;
  int local_4dc;
  int *local_4d8;
  long local_4d0;
  int *local_4c8;
  int *local_4c0;
  uint *local_4b8;
  uint *local_4b0;
  uint *local_4a8;
  uint *local_4a0;
  long local_498;
  long local_490;
  long *local_488;
  uint *local_480;
  uint *local_478;
  uint *local_470;
  uint *local_468;
  uint *local_460;
  uint *local_458;
  uint *local_450;
  uint *local_448;
  InstId local_43c;
  undefined8 *local_438;
  undefined4 local_42c;
  undefined8 *local_428;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined8 *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  uint local_238;
  undefined1 local_231;
  uint *local_230;
  undefined4 local_224;
  uint *local_220;
  uint local_214;
  undefined4 *local_210;
  uint *local_208;
  undefined1 local_1fd;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 *local_1f0;
  undefined4 *local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  uint local_1d0;
  undefined1 local_1c9;
  uint *local_1c8;
  undefined4 local_1bc;
  uint *local_1b8;
  uint local_1ac;
  undefined4 *local_1a8;
  uint *local_1a0;
  undefined1 local_195;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 *local_188;
  undefined4 *local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  uint local_168;
  undefined1 local_161;
  uint *local_160;
  undefined4 local_154;
  uint *local_150;
  uint local_144;
  undefined4 *local_140;
  uint *local_138;
  undefined1 local_12d;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 *local_120;
  undefined4 *local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  uint local_100;
  undefined1 local_f9;
  uint *local_f8;
  undefined4 local_ec;
  uint *local_e8;
  uint local_dc;
  undefined4 *local_d8;
  uint *local_d0;
  undefined1 local_c5;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 *local_b8;
  undefined4 *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_74;
  undefined8 *local_70;
  InstId local_64;
  InstId *local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 *local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined4 *local_28;
  uint local_1c;
  BaseRAPass *local_18;
  undefined4 local_c;
  BaseRAPass *local_8;
  
  local_538 = in_RDI[1] + 0x1e8;
  local_6c4 = *(uint *)(in_RDI[1] + 0x1f0);
  local_6d0 = in_RSI;
  local_6c0 = in_RDX;
  do {
    if (local_6d0 == local_6c0) {
      return 0;
    }
    local_530 = local_6d0;
    local_6d8 = (undefined8 *)local_6d0[1];
    local_528 = local_6d0;
    bVar4 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                      (*(NodeFlags *)((long)local_6d0 + 0x11),kActsAsInst);
    if (bVar4) {
      local_520 = local_6d0;
      local_6e0 = local_6d0;
      local_518 = local_6d0;
      local_6e8 = (long *)local_6d0[4];
      local_680 = local_6d0;
      local_6f0 = (uint *)(local_6d0 + 8);
      local_688 = local_6d0;
      local_6f4 = (uint)*(byte *)((long)local_6d0 + 0x12);
      local_6f8 = 0;
      if (local_6e8 != (long *)0x0) {
        local_510 = local_6d0;
        local_6d0[4] = 0;
        local_708 = (long)local_6e8 + 0x4c;
        local_70c = *(uint *)(local_6e8 + 2);
        local_508 = local_6e8;
        local_500 = local_6e8;
        for (local_6fc = 0; local_6fc < local_70c; local_6fc = local_6fc + 1) {
          local_718 = local_708 + (ulong)local_6fc * 0x20;
          local_4ec = *(int *)(local_718 + 0x18);
          local_4e8 = &local_71c;
          local_720 = (uint)*(byte *)(local_718 + 0xe);
          local_4f8 = local_718;
          local_4d0 = local_718;
          local_71c = local_4ec;
          while (local_4c0 = &local_71c, local_71c != 0) {
            local_4a0 = &local_6f8;
            local_4a8 = &local_720;
            if (local_6f8 < local_720) {
              local_794 = local_720;
            }
            else {
              local_794 = local_6f8;
            }
            local_6f8 = local_794;
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                       (uint32_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                       (uint32_t)in_stack_fffffffffffff7f0);
          }
          local_498 = local_718;
          local_4dc = *(int *)(local_718 + 0x1c);
          local_4d8 = &local_724;
          local_490 = local_718;
          local_728 = (uint)*(byte *)(local_718 + 0xf);
          local_724 = local_4dc;
          while (local_4c8 = &local_724, local_724 != 0) {
            local_4b0 = &local_6f8;
            local_4b8 = &local_728;
            if (local_6f8 < local_728) {
              local_7a4 = local_728;
            }
            else {
              local_7a4 = local_6f8;
            }
            local_6f8 = local_7a4;
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                       (uint32_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                       (uint32_t)in_stack_fffffffffffff7f0);
          }
        }
        local_488 = local_6e8;
        bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                          (*(RATiedFlags *)((long)local_6e8 + 0xc),kInst_RegToMemPatched);
        if (bVar4) {
          local_698 = local_6e0;
          iVar1 = *(int *)(local_6e0 + 6);
          if (iVar1 == 0x165) {
            local_468 = local_6f0;
            local_230 = local_6f0;
            local_231 = 0;
            local_220 = local_6f0;
            local_224 = 0xf07;
            local_238 = *local_6f0 & 0xf07;
            local_1f8 = 1;
            local_1f4 = 1;
            local_240 = 1;
            local_1fd = 0;
            local_244 = 0;
            local_1e8 = &local_240;
            local_1f0 = &local_244;
            local_23c = 1;
            local_208 = &local_238;
            local_210 = &local_23c;
            local_214 = local_238;
            local_1fc = local_244;
            local_1e0 = local_23c;
            if ((local_238 == 1) &&
               (local_630 = local_6f0 + 4, local_628 = local_630, (*local_630 & 7) == 2)) {
              local_578 = local_6f0 + 4;
              local_57c = 1;
              *local_578 = *local_578 & 0xffffff | 0x1000000;
              local_a0 = local_6e0 + 6;
              local_a4 = 0x1de;
              *(undefined4 *)local_a0 = 0x1de;
              local_448 = local_578;
            }
          }
          else if (iVar1 == 0x166) {
LAB_001f765a:
            local_478 = local_6f0;
            local_160 = local_6f0;
            local_161 = 0;
            local_150 = local_6f0;
            local_154 = 0xf07;
            local_168 = *local_6f0 & 0xf07;
            local_128 = 1;
            local_124 = 1;
            local_170 = 1;
            local_12d = 0;
            local_174 = 0;
            local_118 = &local_170;
            local_120 = &local_174;
            local_16c = 1;
            local_138 = &local_168;
            local_140 = &local_16c;
            local_144 = local_168;
            local_12c = local_174;
            local_110 = local_16c;
            if ((local_168 == 1) &&
               (local_650 = local_6f0 + 4, local_648 = local_650, (*local_650 & 7) == 2)) {
              local_598 = local_6f0 + 4;
              local_59c = 4;
              *local_598 = *local_598 & 0xffffff | 0x4000000;
              in_stack_fffffffffffffbe4 = 0x1b7;
              local_80 = local_6e0 + 6;
              local_84 = 0x1b7;
              *(undefined4 *)local_80 = 0x1b7;
              local_458 = local_598;
              in_stack_fffffffffffffbe8 = local_6e0;
            }
          }
          else {
            if (iVar1 != 0x167) {
              if (iVar1 == 0x1bc) goto LAB_001f765a;
              if (iVar1 != 0x1d3) {
                if (iVar1 == 0x4aa) goto LAB_001f765a;
                if (iVar1 != 0x4c0) {
                  if (iVar1 == 0x4c8) {
                    local_470 = local_6f0;
                    local_1c8 = local_6f0;
                    local_1c9 = 0;
                    local_1b8 = local_6f0;
                    local_1bc = 0xf07;
                    local_1d0 = *local_6f0 & 0xf07;
                    local_190 = 1;
                    local_18c = 1;
                    local_1d8 = 1;
                    local_195 = 0;
                    local_1dc = 0;
                    local_180 = &local_1d8;
                    local_188 = &local_1dc;
                    local_1d4 = 1;
                    local_1a0 = &local_1d0;
                    local_1a8 = &local_1d4;
                    local_1ac = local_1d0;
                    local_194 = local_1dc;
                    local_178 = local_1d4;
                    if ((local_1d0 == 1) &&
                       (local_640 = local_6f0 + 4, local_638 = local_640, (*local_640 & 7) == 2)) {
                      local_588 = local_6f0 + 4;
                      local_58c = 2;
                      *local_588 = *local_588 & 0xffffff | 0x2000000;
                      in_stack_fffffffffffffbf4 = 0x1de;
                      local_90 = local_6e0 + 6;
                      local_94 = 0x1de;
                      *(undefined4 *)local_90 = 0x1de;
                      local_450 = local_588;
                    }
                  }
                  goto LAB_001f7b83;
                }
              }
            }
            local_480 = local_6f0;
            local_f8 = local_6f0;
            local_f9 = 0;
            local_e8 = local_6f0;
            local_ec = 0xf07;
            local_100 = *local_6f0 & 0xf07;
            local_c0 = 1;
            local_bc = 1;
            local_108 = 1;
            local_c5 = 0;
            local_10c = 0;
            local_b0 = &local_108;
            local_b8 = &local_10c;
            local_104 = 1;
            local_d0 = &local_100;
            local_d8 = &local_104;
            local_dc = local_100;
            local_c4 = local_10c;
            local_a8 = local_104;
            if ((local_100 == 1) &&
               (local_660 = local_6f0 + 4, local_658 = local_660, (*local_660 & 7) == 2)) {
              local_5a8 = local_6f0 + 4;
              local_5ac = 8;
              *local_5a8 = *local_5a8 & 0xffffff | 0x8000000;
              local_428 = local_6e0;
              local_42c = 0x1b7;
              local_70 = local_6e0 + 6;
              local_74 = 0x1b7;
              *(undefined4 *)local_70 = 0x1b7;
              local_460 = local_5a8;
            }
          }
        }
LAB_001f7b83:
        bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                          (*(RATiedFlags *)((long)local_6e8 + 0xc),kInst_IsTransformable);
        puVar3 = local_6e0;
        if ((bVar4) && (0xf < local_6f8)) {
          local_6a0 = local_6e0;
          local_43c = transformVexToEvex((InstId)in_stack_fffffffffffff7f0);
          local_438 = puVar3;
          local_60 = (InstId *)(puVar3 + 6);
          *local_60 = local_43c;
          local_64 = local_43c;
        }
        bVar4 = Support::test<asmjit::v1_14::InstRWFlags,asmjit::v1_14::InstRWFlags>
                          (*(InstRWFlags *)(local_6e8 + 1),kMovOp);
        if (((bVar4) && (local_610 = local_6e0, *(int *)(local_6e0 + 7) == 0)) &&
           (local_690 = local_6e0, *(char *)((long)local_6e0 + 0x12) == '\x02')) {
          pOVar8 = InstNode::op((InstNode *)
                                CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                                (uint32_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20));
          local_608 = InstNode::op((InstNode *)
                                   CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                                   (uint32_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20));
          local_600 = pOVar8;
          if ((((pOVar8->super_Operand_)._signature._bits ==
                (local_608->super_Operand_)._signature._bits &&
               (pOVar8->super_Operand_)._baseId == (local_608->super_Operand_)._baseId) &&
              (pOVar8->super_Operand_)._data[0] == (local_608->super_Operand_)._data[0]) &&
              (pOVar8->super_Operand_)._data[1] == (local_608->super_Operand_)._data[1]) {
            BaseBuilder::removeNode
                      ((BaseBuilder *)in_stack_fffffffffffff808,
                       (BaseNode *)in_stack_fffffffffffff800);
            goto LAB_001f84ef;
          }
        }
        if ((*(char *)(local_6d0 + 2) != '\x01') && (*(char *)(local_6d0 + 2) == '\x11')) {
          local_730 = *local_6e8;
          bVar4 = BaseRAPass::isNextTo
                            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                             (BaseNode *)0x1f7eee);
          if (!bVar4) {
            local_5d8 = in_RDI[1];
            local_5c8 = local_6d0;
            local_5e0 = *local_6d0;
            *(undefined8 *)(local_5d8 + 0x198) = local_5e0;
            local_54 = *(undefined4 *)(*(long *)(in_RDI[0x13] + 0x338) + 0x30);
            local_50 = &local_744;
            local_44 = 5;
            local_40 = 5;
            local_58 = 5;
            local_30 = &local_58;
            local_38 = 0;
            local_3c = 0;
            local_744 = 5;
            local_73c = 0;
            local_738 = 0;
            local_34 = local_54;
            local_28 = local_50;
            local_740 = local_54;
            EVar5 = (**(code **)(*in_RDI + 0x68))(in_RDI,&local_744);
            if (EVar5 != 0) {
              return EVar5;
            }
            local_734 = 0;
          }
          local_5d0 = local_6d0;
          uVar2 = *local_6d0;
          BaseBuilder::removeNode
                    ((BaseBuilder *)in_stack_fffffffffffff808,(BaseNode *)in_stack_fffffffffffff800)
          ;
          *(undefined8 *)(local_730 + 0x18) = uVar2;
        }
      }
      for (local_6fc = 0; local_6fc < local_6f4; local_6fc = local_6fc + 1) {
        pBVar9 = (BaseRAPass *)(local_6f0 + (ulong)local_6fc * 4);
        local_670 = pBVar9;
        local_668 = pBVar9;
        if ((((ulong)(pBVar9->super_FuncPass).super_Pass._vptr_Pass & 7) == 2) &&
           (local_620 = pBVar9,
           ((ulong)(pBVar9->super_FuncPass).super_Pass._vptr_Pass & 0x2000) != 0)) {
          local_674 = *(uint *)((long)&(pBVar9->super_FuncPass).super_Pass._vptr_Pass + 4);
          local_618 = pBVar9;
          if (local_6c4 <= local_674 - 0x100) {
            EVar5 = DebugUtils::errored(0x1e);
            return EVar5;
          }
          local_5f0 = in_RDI[1];
          local_5f4 = local_674 - 0x100;
          ppVVar10 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                               ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                                CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8),
                                (size_t)in_stack_fffffffffffff7f0);
          local_5e8 = *ppVVar10;
          if (*(long *)(local_5e8 + 0x28) == 0) {
            DebugUtils::assertionFailed
                      ((char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          }
          this_00 = *(RAStackSlot **)(*(long *)(local_5e8 + 0x28) + 0x18);
          iVar6 = RAStackSlot::offset(this_00);
          local_5c0 = (uint *)(in_RDI + 0x3b);
          in_stack_fffffffffffff7ff = (byte)(*local_5c0 >> 3) & 0x1f;
          in_stack_fffffffffffff7f0 = pBVar9;
          local_5b8 = local_5c0;
          uVar7 = RAStackSlot::baseRegId(this_00);
          local_1c = (uint)in_stack_fffffffffffff7ff;
          local_18 = in_stack_fffffffffffff7f0;
          if ((in_stack_fffffffffffff7ff & 0xe0) != 0) {
            DebugUtils::assertionFailed
                      ((char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
          }
          *(uint *)&(in_stack_fffffffffffff7f0->super_FuncPass).super_Pass._vptr_Pass =
               *(uint *)&(in_stack_fffffffffffff7f0->super_FuncPass).super_Pass._vptr_Pass &
               0xffffff07 | local_1c << 3;
          *(uint32_t *)
           ((long)&(in_stack_fffffffffffff7f0->super_FuncPass).super_Pass._vptr_Pass + 4) = uVar7;
          local_c = 0xffffdfff;
          *(uint *)&(pBVar9->super_FuncPass).super_Pass._vptr_Pass =
               *(uint *)&(pBVar9->super_FuncPass).super_Pass._vptr_Pass & 0xffffdfff;
          *(int32_t *)((long)&(pBVar9->super_FuncPass).super_Pass._cb + 4) =
               iVar6 + *(int *)((long)&(pBVar9->super_FuncPass).super_Pass._cb + 4);
          in_stack_fffffffffffff800 = in_stack_fffffffffffff7f0;
          in_stack_fffffffffffff808 = in_stack_fffffffffffff7f0;
          local_56c = iVar6;
          local_568 = pBVar9;
          local_8 = pBVar9;
        }
      }
    }
LAB_001f84ef:
    local_6d0 = local_6d8;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // If one operand was rewritten from Reg to Mem, we have to ensure that we are using the correct instruction.
        if (raInst->isRegToMemPatched()) {
          switch (inst->id()) {
            case Inst::kIdKmovb: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(1);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdVmovw: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(2);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdMovd:
            case Inst::kIdVmovd:
            case Inst::kIdKmovd: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(4);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            case Inst::kIdMovq:
            case Inst::kIdVmovq:
            case Inst::kIdKmovq: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVQ to MOV.
                operands[1].as<Mem>().setSize(8);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            default:
              break;
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}